

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

int64_t __thiscall
TPZCompElWithMem<TPZMultiphysicsInterfaceElement>::GetGlobalIntegrationPointIndex
          (TPZCompElWithMem<TPZMultiphysicsInterfaceElement> *this,TPZMaterialData *data)

{
  int64_t iVar1;
  
  iVar1 = -1;
  if (((this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements != 0) &&
     (-1 < (long)data->intLocPtIndex)) {
    iVar1 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore
            [data->intLocPtIndex];
  }
  return iVar1;
}

Assistant:

inline int64_t TPZCompElWithMem<TBASE>::GetGlobalIntegrationPointIndex(TPZMaterialData &data)
{
    int64_t glIntegralPt = -1;
    auto np = fIntPtIndices.size();
#ifdef PZDEBUG
    if(fIntPtIndices.size()==0 && data.intLocPtIndex)
    {
        std::cout << __PRETTY_FUNCTION__ << "\nInconsistent data structure intLocPtIndex "
        << data.intLocPtIndex << " no point indices ";
    }
#endif
    if (np && data.intLocPtIndex >= 0) {
        glIntegralPt = fIntPtIndices[ data.intLocPtIndex ]; // returning the
    }
    return glIntegralPt;
}